

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

void insert_SNode_internal(Parser *p,SNode *sn)

{
  uint uVar1;
  SNode **__ptr;
  SNode *sn_00;
  uint uVar2;
  SNodeHash *pSVar3;
  SNode **ppSVar4;
  uint m;
  SNode **v;
  SNode *t;
  uint i;
  uint h;
  SNodeHash *ph;
  SNode *sn_local;
  Parser *p_local;
  
  pSVar3 = &p->snode_hash;
  uVar2 = (int)(((long)sn->state - (long)p->t->state) / 0x78 << 0xc) + (int)sn->initial_scope;
  if ((p->snode_hash).m < (p->snode_hash).n + 1) {
    __ptr = pSVar3->v;
    uVar1 = (p->snode_hash).m;
    (p->snode_hash).i = (p->snode_hash).i + 1;
    (p->snode_hash).m = d_prime2[(p->snode_hash).i];
    ppSVar4 = (SNode **)malloc((ulong)(p->snode_hash).m << 3);
    pSVar3->v = ppSVar4;
    memset(pSVar3->v,0,(ulong)(p->snode_hash).m << 3);
    for (t._0_4_ = 0; (uint)t < uVar1; t._0_4_ = (uint)t + 1) {
      while (sn_00 = __ptr[(uint)t], sn_00 != (SNode *)0x0) {
        __ptr[(uint)t] = __ptr[(uint)t]->bucket_next;
        insert_SNode_internal(p,sn_00);
      }
    }
    free(__ptr);
  }
  sn->bucket_next = pSVar3->v[(ulong)uVar2 % (ulong)(p->snode_hash).m];
  if (sn->bucket_next == sn) {
    __assert_fail("sn->bucket_next != sn",
                  "/workspace/llm4binary/github/license_c_cmakelists/jplevyak[P]dparser/parse.c",
                  0xb2,"void insert_SNode_internal(Parser *, SNode *)");
  }
  pSVar3->v[(ulong)uVar2 % (ulong)(p->snode_hash).m] = sn;
  (p->snode_hash).n = (p->snode_hash).n + 1;
  return;
}

Assistant:

void insert_SNode_internal(Parser *p, SNode *sn) {
  SNodeHash *ph = &p->snode_hash;
  uint h = SNODE_HASH(sn->state - p->t->state, sn->initial_scope), i;
  SNode *t;

  if (ph->n + 1 > ph->m) {
    SNode **v = ph->v;
    uint m = ph->m;
    ph->i++;
    ph->m = d_prime2[ph->i];
    ph->v = (SNode **)MALLOC(ph->m * sizeof(*ph->v));
    memset(ph->v, 0, ph->m * sizeof(*ph->v));
    for (i = 0; i < m; i++)
      while ((t = v[i])) {
        v[i] = v[i]->bucket_next;
        insert_SNode_internal(p, t);
      }
    FREE(v);
  }
  sn->bucket_next = ph->v[h % ph->m];
  assert(sn->bucket_next != sn);
  ph->v[h % ph->m] = sn;
  ph->n++;
}